

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

void __thiscall QDockAreaLayout::fitLayout(QDockAreaLayout *this)

{
  QList<QLayoutStruct> *in_RDI;
  long in_FS_OFFSET;
  QList<QLayoutStruct> hor_struct_list;
  QList<QLayoutStruct> ver_struct_list;
  int in_stack_00000094;
  int in_stack_00000098;
  int in_stack_0000009c;
  int in_stack_000000a0;
  int in_stack_000000a4;
  QList<QLayoutStruct> *in_stack_000000a8;
  QList<QLayoutStruct> *in_stack_000000b0;
  QList<QLayoutStruct> *in_stack_000000b8;
  QDockAreaLayout *in_stack_000000c0;
  QRect *this_00;
  QList<QLayoutStruct> *this_01;
  QList<QLayoutStruct> *hor_struct_list_00;
  QDockAreaLayout *this_02;
  QList<QLayoutStruct> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QRect *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.ptr = (QLayoutStruct *)&DAT_aaaaaaaaaaaaaaaa;
  hor_struct_list_00 = &local_28;
  this_01 = (QList<QLayoutStruct> *)0x3;
  QList<QLayoutStruct>::QList((QList<QLayoutStruct> *)0x3,-0x5555555555555556);
  this_02 = (QDockAreaLayout *)&DAT_aaaaaaaaaaaaaaaa;
  QList<QLayoutStruct>::QList(this_01,(qsizetype)this_00);
  getGrid(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0);
  QRect::top((QRect *)0x57abf6);
  QRect::height(this_00);
  qGeomCalc(in_stack_000000a8,in_stack_000000a4,in_stack_000000a0,in_stack_0000009c,
            in_stack_00000098,in_stack_00000094);
  QRect::left((QRect *)0x57ac3a);
  QRect::width(this_00);
  qGeomCalc(in_stack_000000a8,in_stack_000000a4,in_stack_000000a0,in_stack_0000009c,
            in_stack_00000098,in_stack_00000094);
  setGrid(this_02,in_RDI,hor_struct_list_00);
  QList<QLayoutStruct>::~QList((QList<QLayoutStruct> *)0x57ac8b);
  QList<QLayoutStruct>::~QList((QList<QLayoutStruct> *)0x57ac95);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDockAreaLayout::fitLayout()
{
    QList<QLayoutStruct> ver_struct_list(3);
    QList<QLayoutStruct> hor_struct_list(3);
    getGrid(&ver_struct_list, &hor_struct_list);

    qGeomCalc(ver_struct_list, 0, 3, rect.top(), rect.height(), sep);
    qGeomCalc(hor_struct_list, 0, 3, rect.left(), rect.width(), sep);

    setGrid(&ver_struct_list, &hor_struct_list);
}